

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O0

void get_max_peaks(filename_list_node *fln,file_data *result)

{
  void *pvVar1;
  file_data *fd;
  file_data *result_local;
  filename_list_node *fln_local;
  
  pvVar1 = fln->d;
  if (*(int *)((long)pvVar1 + 0x50) != 0) {
    if (result->peak <= *(double *)((long)pvVar1 + 0x28) &&
        *(double *)((long)pvVar1 + 0x28) != result->peak) {
      result->peak = *(double *)((long)pvVar1 + 0x28);
    }
    if (result->true_peak <= *(double *)((long)pvVar1 + 0x30) &&
        *(double *)((long)pvVar1 + 0x30) != result->true_peak) {
      result->true_peak = *(double *)((long)pvVar1 + 0x30);
    }
  }
  return;
}

Assistant:

void
get_max_peaks(struct filename_list_node *fln, struct file_data *result)
{
	struct file_data *fd = (struct file_data *)fln->d;

	if (fd->scanned) {
		if (fd->peak > result->peak) {
			result->peak = fd->peak;
		}
		if (fd->true_peak > result->true_peak) {
			result->true_peak = fd->true_peak;
		}
	}
}